

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

JBLOCKARRAY alloc_barray(j_common_ptr cinfo,int pool_id,JDIMENSION blocksperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  ulong uVar3;
  JBLOCKARRAY ppaJVar4;
  JBLOCKROW paJVar5;
  int iVar6;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar7;
  
  pjVar1 = cinfo->mem;
  uVar9 = 0;
  uVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3b9ac9e8)) / (ZEXT416(blocksperrow) << 7),0);
  if (0x773593 < blocksperrow) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x48;
    (*pjVar2->error_exit)(cinfo);
  }
  if (numrows <= uVar3) {
    uVar3 = (ulong)numrows;
  }
  *(int *)&pjVar1[1].access_virt_sarray = (int)uVar3;
  ppaJVar4 = (JBLOCKARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  while (uVar10 = numrows - uVar9, uVar9 <= numrows && uVar10 != 0) {
    uVar7 = (ulong)uVar10;
    if ((uint)uVar3 < uVar10) {
      uVar7 = uVar3;
    }
    uVar3 = uVar7;
    paJVar5 = (JBLOCKROW)alloc_large(cinfo,pool_id,(ulong)blocksperrow * 0x80 * uVar3);
    uVar7 = uVar3;
    while (iVar6 = (int)uVar7, uVar7 = (ulong)(iVar6 - 1), iVar6 != 0) {
      uVar8 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
      ppaJVar4[uVar8] = paJVar5;
      paJVar5 = paJVar5 + blocksperrow;
    }
  }
  return ppaJVar4;
}

Assistant:

METHODDEF(JBLOCKARRAY)
alloc_barray (j_common_ptr cinfo, int pool_id,
	      JDIMENSION blocksperrow, JDIMENSION numrows)
/* Allocate a 2-D coefficient-block array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  JBLOCKARRAY result;
  JBLOCKROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK-SIZEOF(large_pool_hdr)) /
	  ((long) blocksperrow * SIZEOF(JBLOCK));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long) numrows)
    rowsperchunk = (JDIMENSION) ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JBLOCKARRAY) alloc_small(cinfo, pool_id,
				     (size_t) (numrows * SIZEOF(JBLOCKROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JBLOCKROW) alloc_large(cinfo, pool_id,
	(size_t) ((size_t) rowsperchunk * (size_t) blocksperrow
		  * SIZEOF(JBLOCK)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += blocksperrow;
    }
  }

  return result;
}